

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.cpp
# Opt level: O3

String * __thiscall
asl::TextFile::readLine(String *__return_storage_ptr__,TextFile *this,char newline)

{
  char b;
  int iVar1;
  anon_union_16_2_78e7fdac_for_String_2 *paVar2;
  anon_union_16_2_78e7fdac_for_String_2 *__nbytes;
  bool bVar3;
  char x;
  char local_29;
  
  String::alloc(__return_storage_ptr__,1000);
  __return_storage_ptr__->_len = 0;
  __nbytes = &__return_storage_ptr__->field_2;
  paVar2 = __nbytes;
  if (__return_storage_ptr__->_size != 0) {
    paVar2 = (anon_union_16_2_78e7fdac_for_String_2 *)(__return_storage_ptr__->field_2)._str;
  }
  paVar2->_space[0] = '\0';
  if (__return_storage_ptr__->_size != 0) {
    __nbytes = *(anon_union_16_2_78e7fdac_for_String_2 **)&__return_storage_ptr__->field_2;
  }
  __nbytes->_space[0] = '\0';
  if ((this->super_File)._file == (FILE *)0x0) {
    iVar1 = File::open(&this->super_File,(char *)&(this->super_File)._path,8);
    bVar3 = (this->super_File)._file != (FILE *)0x0;
    __nbytes = (anon_union_16_2_78e7fdac_for_String_2 *)CONCAT71((int7)((ulong)__nbytes >> 8),bVar3)
    ;
    if (((byte)iVar1 & bVar3) == 0) {
      return __return_storage_ptr__;
    }
  }
  while( true ) {
    File::read(&this->super_File,(int)&local_29,(void *)0x1,(size_t)__nbytes);
    b = local_29;
    bVar3 = end(this);
    bVar3 = b == newline || bVar3;
    __nbytes = (anon_union_16_2_78e7fdac_for_String_2 *)CONCAT71((int7)((ulong)__nbytes >> 8),bVar3)
    ;
    if (bVar3) break;
    String::operator+=(__return_storage_ptr__,b);
  }
  return __return_storage_ptr__;
}

Assistant:

String TextFile::readLine(char newline)
{
	String s(1000, 0);
	s[0] = '\0';
	if(!_file && !open(READ))
		return s;
	while (1)
	{
		char c = read<char>();
		if (end() || c == newline)
			break;
		s << c;
	}
	return s;
}